

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd_cgap.h
# Opt level: O1

void __thiscall
bwtil::bsd_cgap::build
          (bsd_cgap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *gaps,bool last,
          cgap_dictionary *D)

{
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *this_00;
  uint uVar1;
  ulint uVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  word_type value;
  undefined7 in_register_00000011;
  ulong uVar8;
  word_type value_00;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  vector<bool,_std::allocator<bool>_> code;
  packed_view<std::vector> local_88;
  unsigned_long local_58;
  cgap_dictionary *local_50;
  packed_view<std::vector> *local_48;
  packed_view<std::vector> *local_40;
  bitview<std::vector> *local_38;
  
  this->W = '@';
  this->D = D;
  if ((int)CONCAT71(in_register_00000011,last) == 0) {
    puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
    uVar2 = lVar10 - 1;
    this->tail = puVar7[lVar10 + -1];
  }
  else {
    this->tail = 0;
    uVar2 = (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  this->n = uVar2;
  this->u = this->tail;
  puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
  uVar8 = (ulong)!last;
  if (uVar6 != uVar8) {
    uVar2 = this->u;
    lVar10 = 0;
    do {
      uVar2 = uVar2 + puVar7[lVar10];
      this->u = uVar2;
      lVar10 = lVar10 + 1;
    } while (uVar6 - uVar8 != lVar10);
  }
  bVar9 = 0x40 - (char)LZCOUNT(this->u);
  if (bVar9 < 2) {
    bVar9 = 1;
  }
  if (this->u == 0) {
    bVar9 = 1;
  }
  uVar1 = (uint)bVar9 * 5;
  this->logu = bVar9;
  this->t = uVar1;
  sVar3 = (this->n / (ulong)uVar1 + 1) - (ulong)(this->n % (ulong)uVar1 == 0);
  this->number_of_blocks = sVar3;
  local_50 = D;
  bv::internal::packed_view<std::vector>::packed_view(&local_88,(ulong)(uint)bVar9,sVar3);
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar7 = (this->first_el)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._bits._container.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._bits._container.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7);
  }
  (this->first_el)._field_mask = local_88._field_mask;
  (this->first_el)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
  (this->first_el)._width = local_88._width;
  if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._bits._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->c = 0;
  puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar7 >> 3 != uVar8) {
    this_00 = &local_50->encoding;
    uVar6 = 0;
    do {
      if (uVar6 % (ulong)this->t != 0) {
        local_58 = puVar7[uVar6];
        pmVar4 = std::
                 map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::operator[](this_00,&local_58);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_88,pmVar4);
        this->c = (ulong)(uint)local_88._size + this->c +
                  ((long)local_88._bits._container.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)local_88._bits._container.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) * 8;
        if (local_88._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
          local_88._bits._container.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._0_12_ = ZEXT812(0);
          local_88._bits._container.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88._size._0_4_ = 0;
          local_88._width = 0;
        }
      }
      uVar6 = uVar6 + 1;
      puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < ((long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) - uVar8
            );
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
             ((this->c >> 6) + 1) - (ulong)((this->c & 0x3f) == 0),(allocator_type *)&local_58);
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar7 = (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7);
  }
  if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._bits._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar9 = 0x40 - (char)LZCOUNT(this->c);
  if (bVar9 < 2) {
    bVar9 = 1;
  }
  if (this->c == 0) {
    bVar9 = 1;
  }
  this->logc = bVar9;
  bv::internal::packed_view<std::vector>::packed_view(&local_88,(ulong)bVar9,this->number_of_blocks)
  ;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar7 = (this->C_addr)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7);
  }
  (this->C_addr)._field_mask = local_88._field_mask;
  (this->C_addr)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
  (this->C_addr)._width = local_88._width;
  if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._bits._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar7 >> 3 != uVar8) {
    local_40 = &this->first_el;
    local_38 = &this->C;
    local_48 = &this->C_addr;
    local_50 = (cgap_dictionary *)&local_50->encoding;
    uVar6 = 0;
    value_00 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + puVar7[uVar6];
      uVar5 = uVar6 / this->t;
      if (uVar6 % (ulong)this->t == 0) {
        sVar3 = (this->first_el)._width;
        bv::internal::bitview<std::vector>::set
                  (&local_40->_bits,sVar3 * uVar5,(uVar5 + 1) * sVar3,lVar10 - 1);
        uVar5 = uVar6 / this->t;
        sVar3 = (this->C_addr)._width;
        bv::internal::bitview<std::vector>::set
                  (&local_48->_bits,sVar3 * uVar5,(uVar5 + 1) * sVar3,value_00);
      }
      else {
        local_58 = puVar7[uVar6];
        pmVar4 = std::
                 map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                               *)local_50,&local_58);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_88,pmVar4);
        uVar5 = (ulong)(uint)local_88._size +
                ((long)local_88._bits._container.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                (long)local_88._bits._container.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start) * 8;
        if ((int)uVar5 == 0) {
          value = 0;
        }
        else {
          uVar11 = 0;
          value = 0;
          do {
            value = (ulong)((uint)(local_88._bits._container.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar11 >> 6] >>
                                  (uVar11 & 0x3f)) & 1) + value * 2;
            uVar11 = uVar11 + 1;
          } while (uVar11 < (uVar5 & 0xffffffff));
        }
        sVar3 = this->c - value_00;
        bv::internal::bitview<std::vector>::set(local_38,sVar3 - (uVar5 & 0xffffffff),sVar3,value);
        if (local_88._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
          local_88._bits._container.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._0_12_ = ZEXT812(0);
          local_88._bits._container.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88._size._0_4_ = 0;
          local_88._width = 0;
        }
        value_00 = value_00 + (uVar5 & 0xffffffff);
      }
      uVar6 = uVar6 + 1;
      puVar7 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < ((long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) - uVar8
            );
  }
  return;
}

Assistant:

void build(vector<ulint> &gaps,bool last, cgap_dictionary * D){

		assert(gaps.size()>0);

		W = sizeof(ulint)*8;

		this->D=D;
		if(last) last=1;

		if(last){

			tail=0;
			n=gaps.size();

		}else{

			tail=gaps[gaps.size()-1];
			n=gaps.size()-1;

		}

		//cout << "n = " << (ulint)n<<endl;

		u = tail;

		//count bits and ones
		for(ulint i=0;i<(gaps.size()-1)+last;++i)
			u+=gaps[i];

		assert(u>0);

		//cout << "u = " << (ulint)u<<endl;

		logu = intlog2(u);

		//compute block size
		t = 5*logu;
		if(t<2) t = 2;

		number_of_blocks = n/t + (n%t!=0);
		first_el = packed_view<vector>(logu,number_of_blocks);

		c=0;

		//count number of bits in C
		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			if(i%t!=0)
				c+=D->encode(gaps[i]).size();

		}

		C = bitview<vector>(c);
		logc = intlog2(c);

		//cout << "log c = " << (ulint)logc<<endl;
		//cout << "log u = " << (ulint)logu<<endl;
		//cout << "t = " << (ulint)t<<endl;

		C_addr = packed_view<vector>(logc,number_of_blocks);

		ulint cumulative_u = 0;
		ulint cumulative_c = 0;

		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			cumulative_u+=gaps[i];

			if(i%t==0){

				assert(cumulative_u>0);
				assert(cumulative_u-1<(ulint(1)<<logu));
				assert(cumulative_c<(ulint(1)<<logc));

				first_el[i/t] = cumulative_u-1;
				C_addr[i/t] = cumulative_c;

			}else{

				auto code = D->encode(gaps[i]);
				uint l = code.size();

				ulint code_ul=0;

				for(uint j=0;j<l;j++)
					code_ul = code_ul*2+code[j];

				assert(code_ul<(ulint(1)<<l));

				//transform to access correctly C:
				//interval [i,i+l) -> [(c-i)-l,c-i)

				assert(c>=(cumulative_c+l));
				ulint left = (c - cumulative_c)-l;
				ulint right = c - cumulative_c;

				C(left,right) = code_ul;

				cumulative_c+=l;

			}

		}

		//cout << "c = " << (ulint)c<<endl;

		/*cout << "first el : "<<endl;
		for(auto i : first_el)
			cout << i << endl;*/

	}